

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::StreamingReporterBase::~StreamingReporterBase(StreamingReporterBase *this)

{
  StreamingReporterBase *this_local;
  
  (this->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__StreamingReporterBase_002bea90;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&this->m_sectionStack);
  LazyStat<Catch::TestCaseInfo>::~LazyStat(&this->currentTestCaseInfo);
  LazyStat<Catch::GroupInfo>::~LazyStat(&this->currentGroupInfo);
  LazyStat<Catch::TestRunInfo>::~LazyStat(&this->currentTestRunInfo);
  Ptr<Catch::IConfig>::~Ptr(&this->m_config);
  SharedImpl<Catch::IStreamingReporter>::~SharedImpl
            (&this->super_SharedImpl<Catch::IStreamingReporter>);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}